

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O3

void penguinV::ExtractChannel
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,uint8_t channelId)

{
  bool bVar1;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar2;
  ExtractChannelForm4 func;
  ImageTypeManager *pIVar3;
  uint8_t local_b1;
  ImageManager manager;
  
  this = ImageTypeManager::instance();
  pFVar2 = ImageTypeManager::functionTable(this,in->_type);
  local_b1 = in->_type;
  func = pFVar2->ExtractChannel;
  if (func == (ExtractChannelForm4)0x0) {
    bVar1 = ImageTypeManager::isIntertypeConversionEnabled(this);
    if (bVar1) {
      ImageTypeManager::imageTypes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&manager,this);
      pIVar3 = manager._registrator;
      if (manager._registrator ==
          (ImageTypeManager *)
          manager._input.
          super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        func = (ExtractChannelForm4)0x0;
      }
      else {
        do {
          pFVar2 = ImageTypeManager::functionTable
                             (this,*(uint8_t *)&(pIVar3->_functionTableMap)._M_t._M_impl);
          func = pFVar2->ExtractChannel;
          if (func != (ExtractChannelForm4)0x0) {
            local_b1 = *(uint8_t *)&(pIVar3->_functionTableMap)._M_t._M_impl;
            break;
          }
          pIVar3 = (ImageTypeManager *)&(pIVar3->_functionTableMap)._M_t._M_impl.field_0x1;
        } while (pIVar3 != (ImageTypeManager *)
                           manager._input.
                           super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      }
      if (manager._registrator != (ImageTypeManager *)0x0) {
        operator_delete(manager._registrator);
      }
    }
    else {
      func = (ExtractChannelForm4)0x0;
    }
  }
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_char)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_uchar
              *)func,"ExtractChannel");
  manager._registrator = ImageTypeManager::instance();
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._type = local_b1;
  (*func)(in,startXIn,startYIn,out,startXOut,startYOut,width,height,channelId);
  anon_unknown.dwarf_3ec06::ImageManager::~ImageManager(&manager);
  return;
}

Assistant:

void ExtractChannel( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut,
                         uint32_t startYOut, uint32_t width, uint32_t height, uint8_t channelId )
    {
        initialize( in, ExtractChannel )
        func( in, startXIn, startYIn, out, startXOut, startYOut, width, height, channelId );
    }